

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O2

StreamIn * prvTidyinitStreamIn(TidyDocImpl *doc,int encoding)

{
  TidyAllocator *pTVar1;
  StreamIn *__s;
  tchar *ptVar2;
  
  __s = (StreamIn *)(*doc->allocator->vtbl->alloc)(doc->allocator,0x160);
  memset(__s,0,0x158);
  __s->curcol = 1;
  __s->curline = 1;
  __s->encoding = encoding;
  __s->doc = doc;
  __s->bufsize = 5;
  pTVar1 = doc->allocator;
  __s->allocator = pTVar1;
  ptVar2 = (tchar *)(*pTVar1->vtbl->alloc)(pTVar1,0x14);
  __s->charbuf = ptVar2;
  __s->curlastpos = 0;
  __s->firstlastpos = 0;
  return __s;
}

Assistant:

StreamIn* TY_(initStreamIn)( TidyDocImpl* doc, int encoding )
{
    StreamIn *in = (StreamIn*) TidyDocAlloc( doc, sizeof(StreamIn) );

    TidyClearMemory( in, sizeof(StreamIn) );
    in->curline = 1;
    in->curcol = 1;
    in->encoding = encoding;
    in->state = FSM_ASCII;
    in->doc = doc;
    in->bufsize = CHARBUF_SIZE;
    in->allocator = doc->allocator;
    in->charbuf = (tchar*)TidyDocAlloc(doc, sizeof(tchar) * in->bufsize);
    InitLastPos( in );
    return in;
}